

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum4096_32.c
# Opt level: O2

uint32_t Hacl_Bignum4096_32_add(uint32_t *a,uint32_t *b,uint32_t *res)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  
  uVar6 = 0;
  for (lVar7 = 0; lVar7 != 0x200; lVar7 = lVar7 + 0x10) {
    uVar2 = *(uint *)((long)a + lVar7);
    uVar4 = (uint)((char)uVar6 != '\0');
    uVar6 = *(uint *)((long)b + lVar7);
    uVar5 = uVar2 + *(uint *)((long)b + lVar7);
    *(uint *)((long)res + lVar7) = uVar5 + uVar4;
    uVar3 = *(uint *)((long)a + lVar7 + 4);
    puVar1 = (uint *)((long)b + lVar7 + 4);
    uVar4 = (uint)(CARRY4(uVar2,uVar6) || CARRY4(uVar5,uVar4));
    uVar6 = *puVar1;
    uVar5 = uVar3 + *puVar1;
    *(uint *)((long)res + lVar7 + 4) = uVar5 + uVar4;
    uVar2 = *(uint *)((long)a + lVar7 + 8);
    puVar1 = (uint *)((long)b + lVar7 + 8);
    uVar4 = (uint)(CARRY4(uVar3,uVar6) || CARRY4(uVar5,uVar4));
    uVar6 = *puVar1;
    uVar5 = uVar2 + *puVar1;
    *(uint *)((long)res + lVar7 + 8) = uVar5 + uVar4;
    uVar3 = *(uint *)((long)a + lVar7 + 0xc);
    puVar1 = (uint *)((long)b + lVar7 + 0xc);
    uVar2 = (uint)(CARRY4(uVar2,uVar6) || CARRY4(uVar5,uVar4));
    uVar6 = *puVar1;
    uVar4 = uVar3 + *puVar1;
    *(uint *)((long)res + lVar7 + 0xc) = uVar4 + uVar2;
    uVar6 = (uint)(CARRY4(uVar3,uVar6) || CARRY4(uVar4,uVar2));
  }
  return uVar6;
}

Assistant:

uint32_t Hacl_Bignum4096_32_add(uint32_t *a, uint32_t *b, uint32_t *res)
{
  uint32_t c = 0U;
  for (uint32_t i = 0U; i < 32U; i++)
  {
    uint32_t t1 = a[4U * i];
    uint32_t t20 = b[4U * i];
    uint32_t *res_i0 = res + 4U * i;
    c = Lib_IntTypes_Intrinsics_add_carry_u32(c, t1, t20, res_i0);
    uint32_t t10 = a[4U * i + 1U];
    uint32_t t21 = b[4U * i + 1U];
    uint32_t *res_i1 = res + 4U * i + 1U;
    c = Lib_IntTypes_Intrinsics_add_carry_u32(c, t10, t21, res_i1);
    uint32_t t11 = a[4U * i + 2U];
    uint32_t t22 = b[4U * i + 2U];
    uint32_t *res_i2 = res + 4U * i + 2U;
    c = Lib_IntTypes_Intrinsics_add_carry_u32(c, t11, t22, res_i2);
    uint32_t t12 = a[4U * i + 3U];
    uint32_t t2 = b[4U * i + 3U];
    uint32_t *res_i = res + 4U * i + 3U;
    c = Lib_IntTypes_Intrinsics_add_carry_u32(c, t12, t2, res_i);
  }
  return c;
}